

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void pulse_server_info_cb(pa_context *c,pa_server_info *i,void *userdata)

{
  char *pcVar1;
  
  free(*userdata);
  free(*(void **)((long)userdata + 8));
  if (i->default_sink_name == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(i->default_sink_name);
  }
  *(char **)userdata = pcVar1;
  if (i->default_source_name == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(i->default_source_name);
  }
  *(char **)((long)userdata + 8) = pcVar1;
  (*cubeb_pa_threaded_mainloop_signal)
            (*(pa_threaded_mainloop **)(*(long *)((long)userdata + 0x20) + 0x10),0);
  return;
}

Assistant:

static void
pulse_server_info_cb(pa_context * c, const pa_server_info * i, void * userdata)
{
  pulse_dev_list_data * list_data = userdata;

  (void)c;

  free(list_data->default_sink_name);
  free(list_data->default_source_name);
  list_data->default_sink_name =
      i->default_sink_name ? strdup(i->default_sink_name) : NULL;
  list_data->default_source_name =
      i->default_source_name ? strdup(i->default_source_name) : NULL;

  WRAP(pa_threaded_mainloop_signal)(list_data->context->mainloop, 0);
}